

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::
vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>_>_>
::reserve(vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>_>_>
          *this,size_t n)

{
  memory_resource *pmVar1;
  optional<std::pair<pbrt::LightHandle,_unsigned_int>_> *poVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar5;
  long lVar6;
  optional<std::pair<pbrt::LightHandle,_unsigned_int>_> *poVar4;
  
  if (this->nAlloc < n) {
    if (n * 0x18 == 0) {
      poVar4 = (optional<std::pair<pbrt::LightHandle,_unsigned_int>_> *)0x0;
    }
    else {
      pmVar1 = (this->alloc).memoryResource;
      iVar3 = (*pmVar1->_vptr_memory_resource[2])(pmVar1,n * 0x18,8);
      poVar4 = (optional<std::pair<pbrt::LightHandle,_unsigned_int>_> *)CONCAT44(extraout_var,iVar3)
      ;
    }
    sVar5 = this->nStored;
    if (sVar5 != 0) {
      poVar2 = this->ptr;
      lVar6 = 0;
      do {
        (&poVar4->set)[lVar6] = (&poVar2->set)[lVar6];
        if ((&poVar2->set)[lVar6] == true) {
          *(undefined8 *)((long)&poVar4->optionalValue + lVar6) = 0;
          *(undefined8 *)((long)&poVar4->optionalValue + lVar6) =
               *(undefined8 *)((long)&poVar2->optionalValue + lVar6);
          *(undefined4 *)((long)&poVar4->optionalValue + lVar6 + 8) =
               *(undefined4 *)((long)&poVar2->optionalValue + lVar6 + 8);
          (&poVar2->set)[lVar6] = false;
        }
        if ((&poVar2->set)[lVar6] == true) {
          (&poVar2->set)[lVar6] = false;
        }
        lVar6 = lVar6 + 0x18;
        sVar5 = sVar5 - 1;
      } while (sVar5 != 0);
    }
    if (this->ptr != (optional<std::pair<pbrt::LightHandle,_unsigned_int>_> *)0x0) {
      pmVar1 = (this->alloc).memoryResource;
      (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->ptr,this->nAlloc * 0x18,8);
    }
    this->nAlloc = n;
    this->ptr = poVar4;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }